

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall
Coverage_invalidNamespaceElement_Test::TestBody(Coverage_invalidNamespaceElement_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98 [8];
  Message local_90 [8];
  unsigned_long local_88 [2];
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  ParserPtr p;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Coverage_invalidNamespaceElement_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n  <component name=\"componentA\" xmlns=\"http://www.cellml.org/notcellml/2.0#\">\n    <variable name=\"variable1\" units=\"dimensionless\"/>\n  </component>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Parser::create
            (SUB81((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_58,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_58);
  libcellml::Parser::parseModel((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  local_88[1] = 3;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_58);
  local_88[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_78,"size_t(3)","p->issueCount()",local_88 + 1,local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::shared_ptr<libcellml::Parser>::~shared_ptr((shared_ptr<libcellml::Parser> *)local_58);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Coverage, invalidNamespaceElement)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n"
        "  <component name=\"componentA\" xmlns=\"http://www.cellml.org/notcellml/2.0#\">\n"
        "    <variable name=\"variable1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ(size_t(3), p->issueCount());
}